

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::GetItem
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,DynamicObject *instance,
          Var originalInstance,uint32 index,Var *value,ScriptContext *requestContext)

{
  bool bVar1;
  BOOL BVar2;
  IndexPropertyDescriptorMap *this_00;
  void **ppvVar3;
  Var pvVar4;
  RecyclableObject *pRVar5;
  RecyclableObject *func;
  IndexPropertyDescriptor *descriptor;
  Var *value_local;
  Var pvStack_30;
  uint32 index_local;
  Var originalInstance_local;
  DynamicObject *instance_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  descriptor = (IndexPropertyDescriptor *)value;
  value_local._4_4_ = index;
  pvStack_30 = originalInstance;
  originalInstance_local = instance;
  instance_local = (DynamicObject *)arr;
  arr_local = (ES5Array *)this;
  BVar2 = Js::JavascriptArray::DirectGetItemAt<void*>(&arr->super_JavascriptArray,index,value);
  if (BVar2 == 0) {
    this_00 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                        (&this->indexPropertyMap);
    bVar1 = IndexPropertyDescriptorMap::TryGetReference
                      (this_00,value_local._4_4_,(IndexPropertyDescriptor **)&func);
    if (bVar1) {
      if (((ulong)(func->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 8) == 0) {
        ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&func->type);
        if (*ppvVar3 == (void *)0x0) {
          pRVar5 = ScriptContext::GetMissingItemResult(requestContext);
          *(RecyclableObject **)descriptor = pRVar5;
        }
        else {
          ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&func->type)
          ;
          pRVar5 = VarTo<Js::RecyclableObject>(*ppvVar3);
          pvVar4 = Js::JavascriptOperators::CallGetter(pRVar5,pvStack_30,requestContext);
          *(Var *)descriptor = pvVar4;
        }
        this_local._4_4_ = 1;
      }
      else {
        pRVar5 = ScriptContext::GetMissingItemResult(requestContext);
        *(RecyclableObject **)descriptor = pRVar5;
        this_local._4_4_ = 0;
      }
    }
    else {
      pRVar5 = ScriptContext::GetMissingItemResult(requestContext);
      *(RecyclableObject **)descriptor = pRVar5;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetItem(ES5Array* arr, DynamicObject* instance, Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
        if (arr->DirectGetItemAt<Var>(index, value))
        {
            return true;
        }

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                *value = requestContext->GetMissingItemResult();
                return false;
            }

            if (descriptor->Getter)
            {
                RecyclableObject* func = VarTo<RecyclableObject>(descriptor->Getter);
                *value = Js::JavascriptOperators::CallGetter(func, originalInstance, requestContext);
            }
            else
            {
                *value = requestContext->GetMissingItemResult();
            }
            return true;
        }

        *value = requestContext->GetMissingItemResult();
        return false;
    }